

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O0

void rtext_activate(_rtext *x,int state)

{
  _glist *x_00;
  _glist *p_Var1;
  _glist *canvas;
  _glist *glist;
  int indx;
  int h;
  int w;
  int state_local;
  _rtext *x_local;
  
  indx = 0;
  glist._4_4_ = 0;
  x_00 = x->x_glist;
  h = state;
  _w = x;
  p_Var1 = glist_getcanvas(x_00);
  if (h == 0) {
    pdgui_vmess("pdtk_text_editing","^si",p_Var1,"",0);
    if (x_00->gl_editor->e_textedfor == _w) {
      x_00->gl_editor->e_textedfor = (_rtext *)0x0;
    }
    _w->x_active = 0;
  }
  else {
    pdgui_vmess("pdtk_text_editing","^si",p_Var1,_w->x_tag,1);
    x_00->gl_editor->e_textedfor = _w;
    x_00->gl_editor->field_0x88 = x_00->gl_editor->field_0x88 & 0xef;
    _w->x_selstart = 0;
    _w->x_dragfrom = 0;
    _w->x_selend = _w->x_bufsize;
    _w->x_active = 1;
  }
  rtext_senditup(_w,2,&indx,(int *)((long)&glist + 4),(int *)&glist);
  return;
}

Assistant:

void rtext_activate(t_rtext *x, int state)
{
    int w = 0, h = 0, indx;
    t_glist *glist = x->x_glist;
    t_canvas *canvas = glist_getcanvas(glist);
    if (state)
    {
        pdgui_vmess("pdtk_text_editing", "^si", canvas, x->x_tag, 1);
        glist->gl_editor->e_textedfor = x;
        glist->gl_editor->e_textdirty = 0;
        x->x_dragfrom = x->x_selstart = 0;
        x->x_selend = x->x_bufsize;
        x->x_active = 1;
    }
    else
    {
        pdgui_vmess("pdtk_text_editing", "^si", canvas, "", 0);
        if (glist->gl_editor->e_textedfor == x)
            glist->gl_editor->e_textedfor = 0;
        x->x_active = 0;
    }
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}